

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_info.h
# Opt level: O2

void __thiscall bloaty::dwarf::LineInfoReader::~LineInfoReader(LineInfoReader *this)

{
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->expanded_filenames_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->standard_opcode_lengths_).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::
  _Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
  ::~_Vector_base(&(this->filenames_).
                   super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
                 );
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&(this->include_directories_).
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 );
  return;
}

Assistant:

LineInfoReader(const File& file) : file_(file), info_(0) {}